

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktx_main.cpp
# Opt level: O2

void __thiscall ktx::Tools::printUsage(Tools *this,ostream *os,Options *options)

{
  string *psVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  format_string<std::__cxx11::basic_string<char>_> fmt;
  format_string<> fmt_00;
  format_string<> fmt_01;
  format_string<> fmt_02;
  format_string<> fmt_03;
  format_string<> fmt_04;
  format_string<> fmt_05;
  format_string<> fmt_06;
  format_string<> fmt_07;
  format_string<> fmt_08;
  format_string<> fmt_09;
  format_string<> fmt_10;
  format_string<> fmt_11;
  format_string<> fmt_12;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  string local_48;
  
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cxxopts::Options::help(&local_48,options,&local_68,true);
  psVar1 = &local_48;
  fmt.str_.size_ = (size_t)psVar1;
  fmt.str_.data_ = (char *)0x2;
  ::fmt::v10::print<std::__cxx11::string>((v10 *)os,(ostream *)0x1dcb84,fmt,in_R8);
  std::__cxx11::string::~string((string *)&local_48);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_68);
  fmt_00.str_.size_ = (size_t)psVar1;
  fmt_00.str_.data_ = (char *)0x1;
  ::fmt::v10::print<>((v10 *)os,(ostream *)0x1cebe2,fmt_00);
  fmt_01.str_.size_ = (size_t)psVar1;
  fmt_01.str_.data_ = (char *)0x14;
  ::fmt::v10::print<>((v10 *)os,(ostream *)"Available commands:\n",fmt_01);
  fmt_02.str_.size_ = (size_t)psVar1;
  fmt_02.str_.data_ = (char *)0x39;
  ::fmt::v10::print<>((v10 *)os,
                      (ostream *)"  create     Create a KTX2 file from various input files\n",fmt_02
                     );
  fmt_03.str_.size_ = (size_t)psVar1;
  fmt_03.str_.data_ = (char *)0x31;
  ::fmt::v10::print<>((v10 *)os,(ostream *)"  deflate    Deflate (supercompress) a KTX2 file\n",
                      fmt_03);
  fmt_04.str_.size_ = (size_t)psVar1;
  fmt_04.str_.data_ = (char *)0x36;
  ::fmt::v10::print<>((v10 *)os,(ostream *)"  extract    Extract selected images from a KTX2 file\n"
                      ,fmt_04);
  fmt_05.str_.size_ = (size_t)psVar1;
  fmt_05.str_.data_ = (char *)0x20;
  ::fmt::v10::print<>((v10 *)os,(ostream *)"  encode     Encode a KTX2 file\n",fmt_05);
  fmt_06.str_.size_ = (size_t)psVar1;
  fmt_06.str_.data_ = (char *)0x23;
  ::fmt::v10::print<>((v10 *)os,(ostream *)"  transcode  Transcode a KTX2 file\n",fmt_06);
  fmt_07.str_.size_ = (size_t)psVar1;
  fmt_07.str_.data_ = (char *)0x31;
  ::fmt::v10::print<>((v10 *)os,(ostream *)"  info       Print information about a KTX2 file\n",
                      fmt_07);
  fmt_08.str_.size_ = (size_t)psVar1;
  fmt_08.str_.data_ = (char *)0x22;
  ::fmt::v10::print<>((v10 *)os,(ostream *)"  validate   Validate a KTX2 file\n",fmt_08);
  fmt_09.str_.size_ = (size_t)psVar1;
  fmt_09.str_.data_ = (char *)0x24;
  ::fmt::v10::print<>((v10 *)os,(ostream *)"  compare    Compare two KTX2 files\n",fmt_09);
  fmt_10.str_.size_ = (size_t)psVar1;
  fmt_10.str_.data_ = (char *)0x39;
  ::fmt::v10::print<>((v10 *)os,
                      (ostream *)"  help       Display help information about the ktx tool\n",fmt_10
                     );
  fmt_11.str_.size_ = (size_t)psVar1;
  fmt_11.str_.data_ = (char *)0x1;
  ::fmt::v10::print<>((v10 *)os,(ostream *)0x1cebe2,fmt_11);
  fmt_12.str_.size_ = (size_t)psVar1;
  fmt_12.str_.data_ = (char *)0x69;
  ::fmt::v10::print<>((v10 *)os,
                      (ostream *)
                      "For detailed usage and description of each subcommand use \'ktx help <command>\'\nor \'ktx <command> --help\'\n"
                      ,fmt_12);
  return;
}

Assistant:

void Tools::printUsage(std::ostream& os, const cxxopts::Options& options) {
    fmt::print(os, "{}", options.help());

    fmt::print(os, "\n");
    fmt::print(os, "Available commands:\n");
    fmt::print(os, "  create     Create a KTX2 file from various input files\n");
    fmt::print(os, "  deflate    Deflate (supercompress) a KTX2 file\n");
    fmt::print(os, "  extract    Extract selected images from a KTX2 file\n");
    fmt::print(os, "  encode     Encode a KTX2 file\n");
    fmt::print(os, "  transcode  Transcode a KTX2 file\n");
    fmt::print(os, "  info       Print information about a KTX2 file\n");
    fmt::print(os, "  validate   Validate a KTX2 file\n");
    fmt::print(os, "  compare    Compare two KTX2 files\n");
    fmt::print(os, "  help       Display help information about the ktx tool\n");
#if KTX_DEVELOPER_FEATURE_PATCH
    fmt::print(os, "  patch      Apple certain patch operations to a KTX2 file.");
#endif
    fmt::print(os, "\n");
    fmt::print(os, "For detailed usage and description of each subcommand use 'ktx help <command>'\n"
                   "or 'ktx <command> --help'\n");
}